

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_tostring(lua_State *L,StkId obj)

{
  int iVar1;
  GCObject *pGVar2;
  bool bVar3;
  char s [32];
  char acStack_38 [32];
  
  bVar3 = obj->tt_ == 3;
  if (bVar3) {
    iVar1 = sprintf(acStack_38,"%.14g",(obj->value_).gc);
    pGVar2 = (GCObject *)luaS_newlstr(L,acStack_38,(long)iVar1);
    (obj->value_).gc = pGVar2;
    obj->tt_ = (pGVar2->gch).tt | 0x40;
  }
  return (uint)bVar3;
}

Assistant:

int luaV_tostring (lua_State *L, StkId obj) {
  if (!ttisnumber(obj))
    return 0;
  else {
    char s[LUAI_MAXNUMBER2STR];
    lua_Number n = nvalue(obj);
    int l = lua_number2str(s, n);
    setsvalue2s(L, obj, luaS_newlstr(L, s, l));
    return 1;
  }
}